

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temper.cpp
# Opt level: O0

void applyTemperament(MidiFile *midifile,string *temperament,int base)

{
  bool bVar1;
  int base_local;
  string *temperament_local;
  MidiFile *midifile_local;
  
  bVar1 = std::operator==(temperament,"pythagorean");
  if (bVar1) {
    applyPythagoreanTemperament(midifile,0);
  }
  else {
    bVar1 = std::operator==(temperament,"meantone");
    if (bVar1) {
      applyMeantoneTemperament(midifile,0);
    }
    else {
      bVar1 = std::operator==(temperament,"kirnberger3");
      if (bVar1) {
        applyKirnberger3Temperament(midifile,0);
      }
      else {
        bVar1 = std::operator==(temperament,"valotti");
        if (bVar1) {
          applyValottiTemperament(midifile,0);
        }
        else {
          bVar1 = std::operator==(temperament,"bad");
          if (bVar1) {
            applyBadTemperament(midifile,0);
          }
          else {
            bVar1 = std::operator==(temperament,"weird");
            if (bVar1) {
              applyWeirdTemperament(midifile,0);
            }
            else {
              bVar1 = std::operator==(temperament,"equal");
              if (bVar1) {
                applyEqualTemperament(midifile,0);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void applyTemperament(MidiFile& midifile, const string& temperament, int base) {
	if (temperament == "pythagorean") {	
		applyPythagoreanTemperament(midifile);
	} else if (temperament == "meantone") {
		applyMeantoneTemperament(midifile);
	} else if (temperament == "kirnberger3") {
		applyKirnberger3Temperament(midifile);
	} else if (temperament == "valotti") {
		applyValottiTemperament(midifile);
	} else if (temperament == "bad") {
		applyBadTemperament(midifile);
	} else if (temperament == "weird") {
		applyWeirdTemperament(midifile);
	} else if (temperament == "equal") {
		applyEqualTemperament(midifile);
	}
}